

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void CopyOrSwap(uint32_t *src,int num_pixels,uint8_t *dst,int swap_on_big_endian)

{
  uint *puVar1;
  uint uVar2;
  
  if (swap_on_big_endian != 0) {
    memcpy(dst,src,(long)num_pixels << 2);
    return;
  }
  puVar1 = src + num_pixels;
  for (; src < puVar1; src = src + 1) {
    uVar2 = *src;
    *(uint *)dst = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    dst = (uint8_t *)((long)dst + 4);
  }
  return;
}

Assistant:

static void CopyOrSwap(const uint32_t* WEBP_RESTRICT src, int num_pixels,
                       uint8_t* WEBP_RESTRICT dst, int swap_on_big_endian) {
  if (is_big_endian() == swap_on_big_endian) {
    const uint32_t* const src_end = src + num_pixels;
    while (src < src_end) {
      const uint32_t argb = *src++;
      WebPUint32ToMem(dst, BSwap32(argb));
      dst += sizeof(argb);
    }
  } else {
    memcpy(dst, src, num_pixels * sizeof(*src));
  }
}